

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int int32_get(cram_block *b,int32_t *val)

{
  int32_t *val_local;
  cram_block *b_local;
  
  if ((long)b->uncomp_size - b->byte < 4) {
    b_local._4_4_ = -1;
  }
  else {
    *val = CONCAT13(b->data[b->byte + 3],
                    CONCAT12(b->data[b->byte + 2],CONCAT11(b->data[b->byte + 1],b->data[b->byte])));
    b->byte = b->byte + 4;
    b_local._4_4_ = 4;
  }
  return b_local._4_4_;
}

Assistant:

int int32_get(cram_block *b, int32_t *val) {
    if (b->uncomp_size - BLOCK_SIZE(b) < 4)
	return -1;

    *val =
	 b->data[b->byte  ]        |
	(b->data[b->byte+1] <<  8) |
	(b->data[b->byte+2] << 16) |
	(b->data[b->byte+3] << 24);
    BLOCK_SIZE(b) += 4;
    return 4;
}